

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

void __thiscall RenX::LadderDatabase::~LadderDatabase(LadderDatabase *this)

{
  Entry *pEVar1;
  const_iterator __position;
  
  *(undefined ***)this = &PTR_process_data_00165300;
  while (pEVar1 = this->m_head,
        __position._M_current =
             g_ladder_databases.
             super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
             _M_impl.super__Vector_impl_data._M_start, pEVar1 != (Entry *)0x0) {
    this->m_end = pEVar1;
    this->m_head = pEVar1->next;
    std::__cxx11::string::~string((string *)&pEVar1->most_recent_name);
    operator_delete(pEVar1,0x140);
  }
  do {
    if (__position._M_current ==
        g_ladder_databases.
        super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00131a14:
      if (default_ladder_database == this) {
        if (g_ladder_databases.
            super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            g_ladder_databases.
            super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          default_ladder_database = (LadderDatabase *)0x0;
        }
        else {
          default_ladder_database =
               *g_ladder_databases.
                super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::__cxx11::string::~string((string *)&this->m_name);
      Jupiter::Database::~Database(&this->super_Database);
      return;
    }
    if (*__position._M_current == this) {
      std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::erase
                (&g_ladder_databases,__position);
      goto LAB_00131a14;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

RenX::LadderDatabase::~LadderDatabase() {
	while (m_head != nullptr) {
		m_end = m_head;
		m_head = m_head->next;
		delete m_end;
	}

	for (auto itr = g_ladder_databases.begin(); itr != g_ladder_databases.end(); ++itr) {
		if (*itr == this) {
			g_ladder_databases.erase(itr);
			break;
		}
	}

	if (RenX::default_ladder_database == this) {
		if (g_ladder_databases.empty()) {
			RenX::default_ladder_database = nullptr;
		}
		else {
			RenX::default_ladder_database = g_ladder_databases[0];
		}
	}
}